

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CastExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CastExpressionSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::ParenthesizedExpressionSyntax&>
          (BumpAllocator *this,ExpressionSyntax *args,Token *args_1,
          ParenthesizedExpressionSyntax *args_2)

{
  Token apostrophe;
  CastExpressionSyntax *pCVar1;
  ParenthesizedExpressionSyntax *in_RCX;
  BumpAllocator *in_RDX;
  CastExpressionSyntax *in_RSI;
  undefined8 in_RDI;
  Info *unaff_retaddr;
  size_t in_stack_ffffffffffffffd8;
  
  pCVar1 = (CastExpressionSyntax *)allocate(in_RDX,(size_t)in_RCX,in_stack_ffffffffffffffd8);
  apostrophe.info = unaff_retaddr;
  apostrophe.kind = (short)in_RDI;
  apostrophe._2_1_ = (char)((ulong)in_RDI >> 0x10);
  apostrophe.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  apostrophe.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::CastExpressionSyntax::CastExpressionSyntax
            (in_RSI,(ExpressionSyntax *)in_RDX,apostrophe,in_RCX);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }